

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O2

Opcode wabt::Opcode::FromCode(uint8_t prefix,uint32_t code)

{
  uint32_t prefix_code;
  Enum EVar1;
  
  prefix_code = PrefixCode(prefix,code);
  if ((prefix_code < 0x10000) && (code == 0 || WabtOpcodeCodeTable[prefix_code] != Unreachable)) {
    return (Opcode)WabtOpcodeCodeTable[prefix_code];
  }
  EVar1 = EncodeInvalidOpcode(prefix_code);
  return (Opcode)EVar1;
}

Assistant:

inline Opcode Opcode::FromCode(uint8_t prefix, uint32_t code) {
  uint32_t prefix_code = PrefixCode(prefix, code);

  if (WABT_LIKELY(prefix_code < WABT_ARRAY_SIZE(WabtOpcodeCodeTable))) {
    uint32_t value = WabtOpcodeCodeTable[prefix_code];
    // The default value in the table is 0. That's a valid value, but only if
    // the code is 0 (for nop).
    if (WABT_LIKELY(value != 0 || code == 0)) {
      return Opcode(static_cast<Enum>(value));
    }
  }

  return Opcode(EncodeInvalidOpcode(prefix_code));
}